

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
xla::GraphCycles::AllNodesInPostOrder
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,GraphCycles *this)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  int32_t local_b4;
  size_type sStack_b0;
  int32_t index;
  int64_t e;
  int64_t i;
  insert_iterator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>
  local_98;
  _Node_iterator_base<int,_false> local_78;
  insert_iterator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>
  local_70;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  undefined1 local_50 [8];
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> free_nodes_set;
  GraphCycles *this_local;
  vector<int,_std::allocator<int>_> *all_nodes;
  
  free_nodes_set._M_h._M_single_bucket = (__node_base_ptr)this;
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::unordered_set
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             local_50);
  local_58._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(&this->rep_->free_nodes_);
  local_60._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(&this->rep_->free_nodes_)
  ;
  local_78._M_cur =
       (__node_type *)
       std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::begin
                 ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                  local_50);
  local_70 = std::
             inserter<std::unordered_set<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>>
                       ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                         *)local_50,(iterator)local_78._M_cur);
  local_98 = std::
             copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::insert_iterator<std::unordered_set<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>>>
                       (local_58,local_60,local_70);
  i._7_1_ = 0;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  sVar2 = std::
          vector<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
          ::size(&this->rep_->nodes_);
  sVar3 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::size
                    ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *
                     )local_50);
  std::vector<int,_std::allocator<int>_>::reserve(__return_storage_ptr__,sVar2 - sVar3);
  e = 0;
  sStack_b0 = std::
              vector<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
              ::size(&this->rep_->nodes_);
  for (; e < (long)sStack_b0; e = e + 1) {
    local_b4 = (int32_t)e;
    bVar1 = anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&contains,
                       (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                        *)local_50,(int32_t)e);
    if (!bVar1) {
      std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_b4);
    }
  }
  anon_unknown_1::SortInPostOrder(&this->rep_->nodes_,__return_storage_ptr__);
  i._7_1_ = 1;
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::~unordered_set
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             local_50);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int32_t> GraphCycles::AllNodesInPostOrder() const {
  std::unordered_set<int32_t> free_nodes_set;
  std::copy(rep_->free_nodes_.begin(), rep_->free_nodes_.end(),
            std::inserter(free_nodes_set, free_nodes_set.begin()));

  std::vector<int32_t> all_nodes;
  all_nodes.reserve(rep_->nodes_.size() - free_nodes_set.size());

  for (int64_t i = 0, e = rep_->nodes_.size(); i < e; i++) {
    int32_t index = static_cast<int32_t>(i);
    if (!contains(free_nodes_set, index)) {
      all_nodes.push_back(index);
    }
  }

  SortInPostOrder(rep_->nodes_, &all_nodes);
  return all_nodes;
}